

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

String * __thiscall
Jinx::Impl::ParseCell_abi_cxx11_
          (String *__return_storage_ptr__,Impl *this,char delimiter,char **current,char *end)

{
  char cVar1;
  char __c;
  char cVar2;
  char **ppcVar3;
  undefined7 in_register_00000011;
  long *plVar4;
  
  plVar4 = (long *)CONCAT71(in_register_00000011,delimiter);
  ppcVar3 = (char **)*plVar4;
  if (ppcVar3 == current) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cVar1 = *(char *)ppcVar3;
    if (cVar1 == '\"') {
      ppcVar3 = (char **)((long)ppcVar3 + 1);
      *plVar4 = (long)ppcVar3;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (ppcVar3 != current) {
      __c = *(char *)ppcVar3;
      if (cVar1 == '\"') {
        if (__c == '\"') {
          ppcVar3 = (char **)((long)ppcVar3 + 1);
          *plVar4 = (long)ppcVar3;
          if (ppcVar3 == current) {
            return __return_storage_ptr__;
          }
          cVar2 = *(char *)ppcVar3;
          if (cVar2 == (char)this) {
            return __return_storage_ptr__;
          }
          if (cVar2 != '\"') {
            if (cVar2 == '\n') {
              return __return_storage_ptr__;
            }
            if (cVar2 == '\r') {
              return __return_storage_ptr__;
            }
            __assert_fail("**current == \'\"\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                          ,0xe26,"String Jinx::Impl::ParseCell(char, const char **, const char *)");
          }
        }
      }
      else {
        if (__c == (char)this) {
          return __return_storage_ptr__;
        }
        if (__c == '\n') {
          return __return_storage_ptr__;
        }
        if (__c == '\r') {
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
      ppcVar3 = (char **)(*plVar4 + 1);
      *plVar4 = (long)ppcVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline String ParseCell(char delimiter, const char ** current, const char * end)
	{
		if (*current == end)
			return String();
		bool isQuoted = false;
		if (**current == '"')
		{
			isQuoted = true;
			++(*current);
		}
		String value;
		while (*current != end)
		{
			const char c = **current;
			if (isQuoted)
			{
				// Since this cell is double-quote delimited, proceed without checking delimiters until
				// we see another double quote character.
				if (c == '"')
				{
					// Advance the iterator and check to see if it's followed by the end of file or
					// delimiters.  If so, we're done parsing.  If not, a second double-quote should
					// follow.
					++(*current);
					if (*current == end || **current == delimiter || IsLineEnd(**current))
						break;
					// If this assert hits, your data is malformed, since an interior double-quote was not
					// followed by a second quote
					assert(**current == '"');
				}
			}
			else
			{
				// This isn't a quote-escaped cell, so check for normal delimiters
				if (c == delimiter || IsLineEnd(c))
					break;
			}
			value += c;
			++(*current);
		}
		return value;
	}